

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.cpp
# Opt level: O0

void multest(int base,int test)

{
  bool bVar1;
  clock_t cVar2;
  clock_t cVar3;
  pointer pBVar4;
  reference pBVar5;
  float fVar6;
  float local_194;
  float local_184;
  float local_174;
  float diviser;
  float t3;
  BN local_150;
  __normal_iterator<BN_*,_std::vector<BN,_std::allocator<BN>_>_> local_138;
  __normal_iterator<BN_*,_std::vector<BN,_std::allocator<BN>_>_> local_130;
  iterator j_2;
  iterator i_3;
  float t2;
  BN local_108;
  __normal_iterator<BN_*,_std::vector<BN,_std::allocator<BN>_>_> local_f0;
  __normal_iterator<BN_*,_std::vector<BN,_std::allocator<BN>_>_> local_e8;
  iterator j_1;
  iterator i_2;
  float t1;
  BN local_c0;
  __normal_iterator<BN_*,_std::vector<BN,_std::allocator<BN>_>_> local_a8;
  __normal_iterator<BN_*,_std::vector<BN,_std::allocator<BN>_>_> local_a0;
  iterator j;
  iterator i_1;
  BN local_68;
  int local_4c;
  undefined1 local_48 [4];
  int i;
  vector<BN,_std::allocator<BN>_> v2;
  vector<BN,_std::allocator<BN>_> v1;
  uint64_t t;
  int test_local;
  int base_local;
  
  std::vector<BN,_std::allocator<BN>_>::vector
            ((vector<BN,_std::allocator<BN>_> *)
             &v2.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<BN,_std::allocator<BN>_>::vector((vector<BN,_std::allocator<BN>_> *)local_48);
  for (local_4c = 0; local_4c < test; local_4c = local_4c + 1) {
    BN::makeRandom(&local_68,(long)base);
    std::vector<BN,_std::allocator<BN>_>::push_back
              ((vector<BN,_std::allocator<BN>_> *)
               &v2.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,&local_68);
    BN::~BN(&local_68);
    BN::makeRandom((BN *)&i_1,(long)base);
    std::vector<BN,_std::allocator<BN>_>::push_back
              ((vector<BN,_std::allocator<BN>_> *)local_48,(value_type *)&i_1);
    BN::~BN((BN *)&i_1);
  }
  cVar2 = clock();
  j = std::vector<BN,_std::allocator<BN>_>::begin
                ((vector<BN,_std::allocator<BN>_> *)
                 &v2.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage);
  local_a0._M_current =
       (BN *)std::vector<BN,_std::allocator<BN>_>::begin
                       ((vector<BN,_std::allocator<BN>_> *)local_48);
  while( true ) {
    local_a8._M_current =
         (BN *)std::vector<BN,_std::allocator<BN>_>::end
                         ((vector<BN,_std::allocator<BN>_> *)
                          &v2.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
    bVar1 = __gnu_cxx::operator!=(&j,&local_a8);
    if (!bVar1) break;
    pBVar4 = __gnu_cxx::__normal_iterator<BN_*,_std::vector<BN,_std::allocator<BN>_>_>::operator->
                       (&j);
    pBVar5 = __gnu_cxx::__normal_iterator<BN_*,_std::vector<BN,_std::allocator<BN>_>_>::operator*
                       (&local_a0);
    BN::classicMultiplication(&local_c0,pBVar4,pBVar5);
    BN::~BN(&local_c0);
    __gnu_cxx::__normal_iterator<BN_*,_std::vector<BN,_std::allocator<BN>_>_>::operator++(&j,0);
    __gnu_cxx::__normal_iterator<BN_*,_std::vector<BN,_std::allocator<BN>_>_>::operator++
              (&local_a0,0);
  }
  cVar3 = clock();
  local_174 = (float)(ulong)(cVar3 - cVar2);
  cVar2 = clock();
  j_1 = std::vector<BN,_std::allocator<BN>_>::begin
                  ((vector<BN,_std::allocator<BN>_> *)
                   &v2.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
                    _M_end_of_storage);
  local_e8._M_current =
       (BN *)std::vector<BN,_std::allocator<BN>_>::begin
                       ((vector<BN,_std::allocator<BN>_> *)local_48);
  while( true ) {
    local_f0._M_current =
         (BN *)std::vector<BN,_std::allocator<BN>_>::end
                         ((vector<BN,_std::allocator<BN>_> *)
                          &v2.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
    bVar1 = __gnu_cxx::operator!=(&j_1,&local_f0);
    if (!bVar1) break;
    pBVar4 = __gnu_cxx::__normal_iterator<BN_*,_std::vector<BN,_std::allocator<BN>_>_>::operator->
                       (&j_1);
    pBVar5 = __gnu_cxx::__normal_iterator<BN_*,_std::vector<BN,_std::allocator<BN>_>_>::operator*
                       (&local_e8);
    BN::fastMultiplication(&local_108,pBVar4,pBVar5);
    BN::~BN(&local_108);
    __gnu_cxx::__normal_iterator<BN_*,_std::vector<BN,_std::allocator<BN>_>_>::operator++(&j_1,0);
    __gnu_cxx::__normal_iterator<BN_*,_std::vector<BN,_std::allocator<BN>_>_>::operator++
              (&local_e8,0);
  }
  cVar3 = clock();
  local_184 = (float)(ulong)(cVar3 - cVar2);
  cVar2 = clock();
  j_2 = std::vector<BN,_std::allocator<BN>_>::begin
                  ((vector<BN,_std::allocator<BN>_> *)
                   &v2.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
                    _M_end_of_storage);
  local_130._M_current =
       (BN *)std::vector<BN,_std::allocator<BN>_>::begin
                       ((vector<BN,_std::allocator<BN>_> *)local_48);
  while( true ) {
    local_138._M_current =
         (BN *)std::vector<BN,_std::allocator<BN>_>::end
                         ((vector<BN,_std::allocator<BN>_> *)
                          &v2.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
    bVar1 = __gnu_cxx::operator!=(&j_2,&local_138);
    if (!bVar1) break;
    pBVar4 = __gnu_cxx::__normal_iterator<BN_*,_std::vector<BN,_std::allocator<BN>_>_>::operator->
                       (&j_2);
    pBVar5 = __gnu_cxx::__normal_iterator<BN_*,_std::vector<BN,_std::allocator<BN>_>_>::operator*
                       (&local_130);
    BN::karatsubaMultiplication(&local_150,pBVar4,pBVar5);
    BN::~BN(&local_150);
    __gnu_cxx::__normal_iterator<BN_*,_std::vector<BN,_std::allocator<BN>_>_>::operator++(&j_2,0);
    __gnu_cxx::__normal_iterator<BN_*,_std::vector<BN,_std::allocator<BN>_>_>::operator++
              (&local_130,0);
  }
  cVar3 = clock();
  local_194 = (float)(ulong)(cVar3 - cVar2);
  fVar6 = (float)test;
  printf("%d\t%d\t%d\t%.2f\t\t%.2f\t\t%.2f\n",(double)(local_174 / fVar6),
         (double)(local_184 / fVar6),(double)(local_194 / fVar6),(ulong)(uint)base,
         (ulong)(uint)(base << 3),(ulong)(uint)test);
  std::vector<BN,_std::allocator<BN>_>::~vector((vector<BN,_std::allocator<BN>_> *)local_48);
  std::vector<BN,_std::allocator<BN>_>::~vector
            ((vector<BN,_std::allocator<BN>_> *)
             &v2.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  return;
}

Assistant:

void multest(int base,int test)
{
        uint64_t t;
        vector <BN> v1;
        vector <BN> v2;

        for(int i=0;i<test;i++) {
                v1.push_back(BN::makeRandom(base));
                v2.push_back(BN::makeRandom(base));
        }

        t = clock();
        for(vector <BN> :: iterator i = v1.begin(), j = v2.begin(); i != v1.end(); i++, j++)
            i->classicMultiplication(*j);
        float t1 = clock() - t;

        t = clock();
        for(vector <BN> :: iterator i = v1.begin(), j = v2.begin(); i != v1.end(); i++, j++)
            i->fastMultiplication(*j);
        float t2 = clock() - t;

        t = clock();
        for(vector <BN> :: iterator i = v1.begin(), j = v2.begin(); i != v1.end(); i++, j++)
            i->karatsubaMultiplication(*j);
        float t3 = clock() - t;

        float diviser = test;
        t1 /= diviser;
        t2 /= diviser;
        t3 /= diviser;

        printf("%d\t%d\t%d\t%.2f\t\t%.2f\t\t%.2f\n",base,(int)(base*8),(int)test, t1, t2, t3);
}